

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

int next_segment(vorb *f)

{
  byte bVar1;
  int iVar2;
  vorb *in_RDI;
  int len;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  if (in_RDI->last_seg != 0) {
    return 0;
  }
  if (in_RDI->next_seg == -1) {
    in_RDI->last_seg_which = in_RDI->segment_count + -1;
    iVar2 = start_page((vorb *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    if (iVar2 == 0) {
      in_RDI->last_seg = 1;
      return 0;
    }
    if ((in_RDI->page_flag & 1) == 0) {
      iVar2 = error(in_RDI,VORBIS_continued_packet_flag_invalid);
      return iVar2;
    }
  }
  iVar2 = in_RDI->next_seg;
  in_RDI->next_seg = iVar2 + 1;
  bVar1 = in_RDI->segments[iVar2];
  if (bVar1 < 0xff) {
    in_RDI->last_seg = 1;
    in_RDI->last_seg_which = in_RDI->next_seg + -1;
  }
  if (in_RDI->segment_count <= in_RDI->next_seg) {
    in_RDI->next_seg = -1;
  }
  in_RDI->bytes_in_seg = bVar1;
  return (uint)bVar1;
}

Assistant:

static int next_segment(vorb *f)
{
   int len;
   if (f->last_seg) return 0;
   if (f->next_seg == -1) {
      f->last_seg_which = f->segment_count-1; // in case start_page fails
      if (!start_page(f)) { f->last_seg = 1; return 0; }
      if (!(f->page_flag & PAGEFLAG_continued_packet)) return error(f, VORBIS_continued_packet_flag_invalid);
   }
   len = f->segments[f->next_seg++];
   if (len < 255) {
      f->last_seg = TRUE;
      f->last_seg_which = f->next_seg-1;
   }
   if (f->next_seg >= f->segment_count)
      f->next_seg = -1;
   assert(f->bytes_in_seg == 0);
   f->bytes_in_seg = len;
   return len;
}